

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O3

bool __thiscall
spirv_cross::Compiler::PhysicalStorageBufferPointerHandler::handle
          (PhysicalStorageBufferPointerHandler *this,Op op,uint32_t *args,uint32_t param_3)

{
  SPIRType *pSVar1;
  __hashtable *__h;
  __node_gen_type __node_gen;
  
  if (((((op & ~OpSourceExtension) == OpConvertUToPtr) &&
       (pSVar1 = Variant::get<spirv_cross::SPIRType>
                           ((this->compiler->ir).ids.super_VectorView<spirv_cross::Variant>.ptr +
                            *args), pSVar1->storage == StorageClassPhysicalStorageBuffer)) &&
      (pSVar1->pointer == true)) &&
     ((pSVar1->pointer_depth == 1 && (*(int *)&(pSVar1->super_IVariant).field_0xc != 0xf)))) {
    ::std::
    _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::
    _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
              ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)&this->types,args);
  }
  return true;
}

Assistant:

bool Compiler::PhysicalStorageBufferPointerHandler::handle(Op op, const uint32_t *args, uint32_t)
{
	if (op == OpConvertUToPtr || op == OpBitcast)
	{
		auto &type = compiler.get<SPIRType>(args[0]);
		if (type.storage == StorageClassPhysicalStorageBufferEXT && type.pointer && type.pointer_depth == 1)
		{
			// If we need to cast to a pointer type which is not a block, we might need to synthesize ourselves
			// a block type which wraps this POD type.
			if (type.basetype != SPIRType::Struct)
				types.insert(args[0]);
		}
	}

	return true;
}